

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

shared_ptr<mocker::nasm::Inst> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::shared_ptr<Register>_> *mp)

{
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  shared_ptr<mocker::nasm::Inst> sVar4;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Inst> local_98;
  shared_ptr<mocker::nasm::Addr> local_88;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<mocker::nasm::Addr> local_68;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<mocker::nasm::Inst> local_38;
  
  std::dynamic_pointer_cast<mocker::nasm::Empty,mocker::nasm::Inst>(&local_98);
  if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::dynamic_pointer_cast<mocker::nasm::Ret,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&local_58);
    if (local_58._M_ptr != (element_type *)0x0) {
LAB_0018f84a:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      goto LAB_0018f854;
    }
    std::dynamic_pointer_cast<mocker::nasm::Call,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&local_88);
    if (local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0018f84a;
    }
    std::dynamic_pointer_cast<mocker::nasm::Leave,mocker::nasm::Inst>
              ((shared_ptr<mocker::nasm::Inst> *)&local_78);
    bVar3 = true;
    if (local_78._M_ptr == (element_type *)0x0) {
      std::dynamic_pointer_cast<mocker::nasm::Jmp,mocker::nasm::Inst>
                ((shared_ptr<mocker::nasm::Inst> *)&local_68);
      bVar3 = true;
      if (CONCAT44(local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._4_4_,
                   local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr._0_4_) == 0) {
        std::dynamic_pointer_cast<mocker::nasm::CJump,mocker::nasm::Inst>
                  ((shared_ptr<mocker::nasm::Inst> *)&local_48);
        bVar3 = true;
        if (CONCAT44(local_48._M_ptr._4_4_,local_48._M_ptr._0_4_) == 0) {
          std::dynamic_pointer_cast<mocker::nasm::Cqo,mocker::nasm::Inst>(&local_38);
          bVar3 = local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_38.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (!bVar3) {
      std::dynamic_pointer_cast<mocker::nasm::Mov,mocker::nasm::Inst>(&local_98);
      if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::dynamic_pointer_cast<mocker::nasm::Lea,mocker::nasm::Inst>(&local_98);
        if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::dynamic_pointer_cast<mocker::nasm::UnaryInst,mocker::nasm::Inst>(&local_98);
          if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::dynamic_pointer_cast<mocker::nasm::BinaryInst,mocker::nasm::Inst>(&local_98);
            if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (element_type *)0x0) {
              local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _0_4_ = *(undefined4 *)
                       &local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr[1]._vptr_Inst;
              replaceRegs((nasm *)&local_88,
                          (shared_ptr<mocker::nasm::Addr> *)
                          (local_98.
                           super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          + 2),mp);
              replaceRegs((nasm *)&local_78,
                          (shared_ptr<mocker::nasm::Addr> *)
                          (local_98.
                           super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          + 4),mp);
              std::
              make_shared<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
                        ((OpType *)&local_58,&local_68,&local_88);
LAB_0018fba3:
              _Var2._M_pi = local_58._M_refcount._M_pi;
              local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              *(element_type **)this = local_58._M_ptr;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
              local_58._M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_58._M_refcount);
              p_Var1 = &local_78;
LAB_0018fbc2:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount)
              ;
              this_00 = &local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount;
              goto LAB_0018fb28;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::dynamic_pointer_cast<mocker::nasm::Push,mocker::nasm::Inst>(&local_98);
            if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                == (element_type *)0x0) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_98.
                          super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::dynamic_pointer_cast<mocker::nasm::Pop,mocker::nasm::Inst>(&local_98);
              if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == (element_type *)0x0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_98.
                            super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Cmp,mocker::nasm::Inst>(&local_98);
                if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  replaceRegs((nasm *)&local_88,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_98.
                               super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 1),mp);
                  replaceRegs((nasm *)&local_78,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_98.
                               super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 3),mp);
                  std::
                  make_shared<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
                            ((shared_ptr<mocker::nasm::Addr> *)&local_58,&local_88);
                  goto LAB_0018fba3;
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_98.
                            super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::dynamic_pointer_cast<mocker::nasm::Set,mocker::nasm::Inst>(&local_98);
                if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (element_type *)0x0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&local_98.
                              super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::dynamic_pointer_cast<mocker::nasm::IDiv,mocker::nasm::Inst>(&local_98);
                  if (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr == (element_type *)0x0) {
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_98.
                                super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                  ,0xdd,
                                  "std::shared_ptr<Inst> mocker::nasm::replaceRegs(const std::shared_ptr<Inst> &, const RegMap<std::shared_ptr<Register>> &)"
                                 );
                  }
                  replaceRegs((nasm *)&local_88,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_98.
                               super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 1),mp);
                  std::make_shared<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Addr>>
                            ((shared_ptr<mocker::nasm::Addr> *)&local_58);
                  _Var2._M_pi = local_58._M_refcount._M_pi;
                  p_Var1 = &local_58;
                  local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  *(element_type **)this = local_58._M_ptr;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
                  local_58._M_ptr = (element_type *)0x0;
                  goto LAB_0018fbc2;
                }
                local_48._M_ptr._0_4_ =
                     *(undefined4 *)
                      &local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr[1]._vptr_Inst;
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::nasm::Register,void>
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                           (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                           (local_98.
                            super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 2));
                replaceRegs((nasm *)&local_78,&local_68,mp);
                std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_88);
                std::
                make_shared<mocker::nasm::Set,mocker::nasm::Set::OpType,std::shared_ptr<mocker::nasm::Register>>
                          ((OpType *)&local_58,(shared_ptr<mocker::nasm::Register> *)&local_48);
              }
              else {
                std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<mocker::nasm::Register,void>
                          ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                           (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                           (local_98.
                            super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1));
                replaceRegs((nasm *)&local_78,&local_68,mp);
                std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_88);
                std::make_shared<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Register>>
                          ((shared_ptr<mocker::nasm::Register> *)&local_58);
              }
            }
            else {
              std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<mocker::nasm::Register,void>
                        ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                         (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                         (local_98.
                          super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         + 1));
              replaceRegs((nasm *)&local_78,&local_68,mp);
              std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_88);
              std::make_shared<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>>
                        ((shared_ptr<mocker::nasm::Register> *)&local_58);
            }
          }
          else {
            local_48._M_ptr._0_4_ =
                 *(undefined4 *)
                  &local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr[1]._vptr_Inst;
            std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<mocker::nasm::Register,void>
                      ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                       (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                       (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 2));
            replaceRegs((nasm *)&local_78,&local_68,mp);
            std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_88);
            std::
            make_shared<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>>
                      ((OpType *)&local_58,(shared_ptr<mocker::nasm::Register> *)&local_48);
          }
          _Var2._M_pi = local_58._M_refcount._M_pi;
          p_Var1 = &local_58;
          local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(element_type **)this = local_58._M_ptr;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
          local_58._M_ptr = (element_type *)0x0;
        }
        else {
          std::__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mocker::nasm::Register,void>
                    ((__shared_ptr<mocker::nasm::Addr,(__gnu_cxx::_Lock_policy)2> *)&local_68,
                     (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1));
          replaceRegs((nasm *)&local_78,&local_68,mp);
          std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_88);
          replaceRegs((nasm *)&local_48,
                      (shared_ptr<mocker::nasm::Addr> *)
                      (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 3),mp);
          std::
          make_shared<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>,std::shared_ptr<mocker::nasm::Addr>>
                    ((shared_ptr<mocker::nasm::Register> *)&local_58,&local_88);
          _Var2._M_pi = local_58._M_refcount._M_pi;
          local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(element_type **)this = local_58._M_ptr;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
          local_58._M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
          p_Var1 = &local_48;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        this_00 = &local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
      }
      else {
        std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,
                   (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1));
        replaceRegs((nasm *)&local_88,(shared_ptr<mocker::nasm::Addr> *)&local_78,mp);
        std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_48,
                   (__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 3));
        replaceRegs((nasm *)&local_68,(shared_ptr<mocker::nasm::Addr> *)&local_48,mp);
        std::
        make_shared<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
                  ((shared_ptr<mocker::nasm::Addr> *)&local_58,&local_88);
        _Var2._M_pi = local_58._M_refcount._M_pi;
        local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)this = local_58._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
        local_58._M_ptr = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_68.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_88.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        this_00 = &local_78._M_refcount;
      }
LAB_0018fb28:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var2._M_pi = extraout_RDX_00;
      goto LAB_0018f869;
    }
  }
  else {
LAB_0018f854:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_98.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2> *)this,
             &inst->super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>);
  _Var2._M_pi = extraout_RDX;
LAB_0018f869:
  sVar4.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Inst>)
         sVar4.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Inst> replaceRegs(const std::shared_ptr<Inst> &inst,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  if (dyc<Empty>(inst) || dyc<Ret>(inst) || dyc<Call>(inst) ||
      dyc<Leave>(inst) || dyc<Jmp>(inst) || dyc<CJump>(inst) || dyc<Cqo>(inst))
    return inst;
  if (auto p = dyc<Mov>(inst)) {
    return std::make_shared<Mov>(replaceRegs(p->getDest(), mp),
                                 replaceRegs(p->getOperand(), mp));
  }
  if (auto p = dyc<Lea>(inst)) {
    return std::make_shared<Lea>(dyc<Register>(replaceRegs(p->getDest(), mp)),
                                 replaceRegs(p->getAddr(), mp));
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return std::make_shared<UnaryInst>(
        p->getOp(), dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return std::make_shared<BinaryInst>(p->getType(),
                                        replaceRegs(p->getLhs(), mp),
                                        replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Push>(inst)) {
    return std::make_shared<Push>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Pop>(inst)) {
    return std::make_shared<Pop>(dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<Cmp>(inst)) {
    return std::make_shared<Cmp>(replaceRegs(p->getLhs(), mp),
                                 replaceRegs(p->getRhs(), mp));
  }
  if (auto p = dyc<Set>(inst)) {
    return std::make_shared<Set>(p->getOp(),
                                 dyc<Register>(replaceRegs(p->getReg(), mp)));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return std::make_shared<IDiv>(replaceRegs(p->getRhs(), mp));
  }
  assert(false);
}